

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsFoodWeb_ASAi_kry.c
# Opt level: O2

sunrealtype doubleIntgr(N_Vector c,int i,WebData wdata)

{
  double dVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  undefined4 in_register_00000034;
  long lVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  double *pdVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  int iVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  
  lVar5 = CONCAT44(in_register_00000034,i);
  lVar3 = N_VGetArrayPointer();
  iVar2 = *(int *)(lVar5 + 0x40);
  iVar4 = *(int *)(lVar5 + 0x44);
  dVar14 = *(double *)(lVar3 + 0x28);
  lVar6 = (long)*(int *)(lVar5 + 0x50) + -1;
  pdVar9 = (double *)(lVar3 + (long)iVar2 * 8 + 0x28);
  for (lVar11 = 1; lVar11 < lVar6; lVar11 = lVar11 + 1) {
    dVar14 = dVar14 + *pdVar9 + *pdVar9;
    pdVar9 = pdVar9 + iVar2;
  }
  iVar8 = (int)lVar6 * iVar2;
  dVar15 = *(double *)(lVar5 + 0x310) * 0.5;
  dVar14 = (dVar14 + *(double *)(lVar3 + 0x28 + (long)iVar8 * 8)) * dVar15;
  lVar7 = (long)*(int *)(lVar5 + 0x54) + -1;
  iVar10 = iVar4 + iVar2 + 5;
  for (lVar11 = 1; lVar11 < lVar7; lVar11 = lVar11 + 1) {
    dVar16 = *(double *)(lVar3 + 0x28 + lVar11 * iVar4 * 8);
    iVar13 = iVar10;
    for (lVar12 = 1; lVar12 < lVar6; lVar12 = lVar12 + 1) {
      dVar1 = *(double *)(lVar3 + (long)iVar13 * 8);
      dVar16 = dVar16 + dVar1 + dVar1;
      iVar13 = iVar13 + iVar2;
    }
    dVar16 = (dVar16 + *(double *)(lVar3 + (long)iVar8 * 8 + 0x28 + lVar11 * iVar4 * 8)) * dVar15;
    dVar14 = dVar14 + dVar16 + dVar16;
    iVar10 = iVar10 + iVar4;
  }
  iVar4 = iVar4 * (int)lVar7;
  dVar16 = *(double *)(lVar3 + 0x28 + (long)iVar4 * 8);
  iVar10 = iVar4 + iVar2 + 5;
  for (lVar11 = 1; lVar11 < lVar6; lVar11 = lVar11 + 1) {
    dVar1 = *(double *)(lVar3 + (long)iVar10 * 8);
    dVar16 = dVar16 + dVar1 + dVar1;
    iVar10 = iVar10 + iVar2;
  }
  return *(double *)(lVar5 + 0x318) * 0.5 *
         (dVar14 + dVar15 * (dVar16 + *(double *)(lVar3 + (long)(iVar8 + 5 + iVar4) * 8)));
}

Assistant:

static sunrealtype doubleIntgr(N_Vector c, int i, WebData wdata)
{
  sunrealtype* cdata;
  int ns, mx, my, mxns;
  sunrealtype dx, dy;
  sunrealtype intgr_xy, intgr_x;
  int jx, jy;

  cdata = N_VGetArrayPointer(c);

  ns   = wdata->ns;
  mx   = wdata->mx;
  my   = wdata->my;
  mxns = wdata->mxns;
  dx   = wdata->dx;
  dy   = wdata->dy;

  jy      = 0;
  intgr_x = cdata[(i - 1) + jy * mxns];
  for (jx = 1; jx < mx - 1; jx++)
  {
    intgr_x += TWO * cdata[(i - 1) + jx * ns + jy * mxns];
  }
  intgr_x += cdata[(i - 1) + (mx - 1) * ns + jy * mxns];
  intgr_x *= SUN_RCONST(0.5) * dx;

  intgr_xy = intgr_x;

  for (jy = 1; jy < my - 1; jy++)
  {
    intgr_x = cdata[(i - 1) + jy * mxns];
    for (jx = 1; jx < mx - 1; jx++)
    {
      intgr_x += TWO * cdata[(i - 1) + jx * ns + jy * mxns];
    }
    intgr_x += cdata[(i - 1) + (mx - 1) * ns + jy * mxns];
    intgr_x *= SUN_RCONST(0.5) * dx;

    intgr_xy += TWO * intgr_x;
  }

  jy      = my - 1;
  intgr_x = cdata[(i - 1) + jy * mxns];
  for (jx = 1; jx < mx - 1; jx++)
  {
    intgr_x += TWO * cdata[(i - 1) + jx * ns + jy * mxns];
  }
  intgr_x += cdata[(i - 1) + (mx - 1) * ns + jy * mxns];
  intgr_x *= SUN_RCONST(0.5) * dx;

  intgr_xy += intgr_x;

  intgr_xy *= SUN_RCONST(0.5) * dy;

  return (intgr_xy);
}